

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::StreamingConcatenationExpression::isFixedSize(StreamingConcatenationExpression *this)

{
  bool bVar1;
  Expression *pEVar2;
  StreamingConcatenationExpression *in_RDI;
  StreamExpression *stream;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range2;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *in_stack_ffffffffffffffb8;
  reference in_stack_ffffffffffffffc0;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_28;
  StreamingConcatenationExpression *this_00;
  
  local_28 = streams(in_RDI);
  this_00 = (StreamingConcatenationExpression *)&local_28;
  local_30._M_current =
       (StreamExpression *)
       std::
       span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  ::end(in_stack_ffffffffffffffc8);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
         ::operator*(&local_30);
    pEVar2 = not_null<const_slang::ast::Expression_*>::operator->
                       ((not_null<const_slang::ast::Expression_*> *)0xa48528);
    if (pEVar2->kind == Streaming) {
      pEVar2 = not_null<const_slang::ast::Expression_*>::operator->
                         ((not_null<const_slang::ast::Expression_*> *)0xa48537);
      Expression::as<slang::ast::StreamingConcatenationExpression>(pEVar2);
      bVar1 = isFixedSize(this_00);
      if (!bVar1) {
        return false;
      }
    }
    else if (in_stack_ffffffffffffffc0->withExpr == (Expression *)0x0) {
      not_null<const_slang::ast::Expression_*>::operator->
                ((not_null<const_slang::ast::Expression_*> *)0xa48585);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa48591)
      ;
      bVar1 = Type::isFixedSize((Type *)stream);
      if (!bVar1) {
        return false;
      }
    }
    else {
      bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0xa4856e);
      if (!bVar1) {
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

bool StreamingConcatenationExpression::isFixedSize() const {
    for (auto& stream : streams()) {
        if (stream.operand->kind == ExpressionKind::Streaming) {
            if (!stream.operand->as<StreamingConcatenationExpression>().isFixedSize())
                return false;
        }
        else if (stream.withExpr) {
            if (!stream.constantWithWidth.has_value())
                return false;
        }
        else {
            if (!stream.operand->type->isFixedSize())
                return false;
        }
    }
    return true;
}